

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O2

uint Ga2_ObjComputeTruthSpecial(Gia_Man_t *p,Gia_Obj_t *pRoot,Vec_Int_t *vLeaves,Vec_Int_t *vLits)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  Gia_Obj_t *pGVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  uint *puVar13;
  ulong uVar14;
  int pUsed [5];
  
  if (((int)(uint)*(undefined8 *)pRoot < 0) ||
     (((uint)*(undefined8 *)pRoot & 0x1fffffff) == 0x1fffffff)) {
    __assert_fail("Gia_ObjIsAnd(pRoot)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                  ,0x208,
                  "unsigned int Ga2_ObjComputeTruthSpecial(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, Vec_Int_t *)"
                 );
  }
  puVar13 = Ga2_ManComputeTruth::uTruth5;
  for (lVar11 = 0; lVar11 < vLeaves->nSize; lVar11 = lVar11 + 1) {
    iVar1 = Vec_IntEntry(vLeaves,(int)lVar11);
    pGVar7 = Gia_ManObj(p,iVar1);
    if (pGVar7 == (Gia_Obj_t *)0x0) break;
    uVar2 = Vec_IntEntry(vLits,(int)lVar11);
    if ((int)uVar2 < 0) {
      __assert_fail("Entry >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                    ,0x211,
                    "unsigned int Ga2_ObjComputeTruthSpecial(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    uVar3 = uVar2;
    if ((uVar2 != 0) && (uVar3 = 0xffffffff, uVar2 != 1)) {
      uVar3 = *puVar13;
    }
    pGVar7->Value = uVar3;
    puVar13 = puVar13 + 1;
  }
  uVar2 = Ga2_ObjComputeTruth_rec(p,pRoot,1);
  if (uVar2 - 1 < 0xfffffffe) {
    uVar14 = 0;
    for (iVar1 = 0; iVar5 = (int)uVar14, iVar1 < vLeaves->nSize; iVar1 = iVar1 + 1) {
      uVar3 = Ga2_ObjTruthDepends(uVar2,iVar1);
      if (uVar3 != 0) {
        uVar14 = (ulong)(iVar5 + 1);
        pUsed[iVar5] = iVar1;
      }
    }
    if (iVar5 < 1) {
      __assert_fail("nUsed > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                    ,0x22c,
                    "unsigned int Ga2_ObjComputeTruthSpecial(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    uVar9 = 1;
    for (uVar10 = 0; uVar10 != iVar5 - 1; uVar10 = uVar10 + 1) {
      uVar12 = uVar10 & 0xffffffff;
      uVar8 = uVar9;
      while( true ) {
        uVar2 = (uint)uVar12;
        if (uVar14 == uVar8) break;
        iVar1 = Vec_IntEntry(vLits,pUsed[uVar8]);
        iVar4 = Vec_IntEntry(vLits,pUsed[(int)uVar2]);
        uVar3 = (uint)uVar8;
        if (iVar4 <= iVar1) {
          uVar3 = uVar2;
        }
        uVar8 = uVar8 + 1;
        uVar12 = (ulong)uVar3;
      }
      iVar1 = pUsed[uVar10];
      pUsed[uVar10] = pUsed[(int)uVar2];
      pUsed[(int)uVar2] = iVar1;
      uVar9 = uVar9 + 1;
    }
    iVar1 = Vec_IntEntry(vLits,pUsed[0]);
    iVar5 = Vec_IntEntry(vLits,pUsed[iVar5 - 1]);
    if (iVar5 < iVar1) {
      __assert_fail("Vec_IntEntry(vLits, pUsed[0]) <= Vec_IntEntry(vLits, pUsed[nUsed-1])",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                    ,0x22f,
                    "unsigned int Ga2_ObjComputeTruthSpecial(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    for (iVar1 = 0; iVar1 < vLeaves->nSize; iVar1 = iVar1 + 1) {
      iVar5 = Vec_IntEntry(vLeaves,iVar1);
      pGVar7 = Gia_ManObj(p,iVar5);
      if (pGVar7 == (Gia_Obj_t *)0x0) break;
      iVar5 = Vec_IntEntry(vLits,iVar1);
      if (iVar5 < 0) {
        __assert_fail("Entry >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                      ,0x234,
                      "unsigned int Ga2_ObjComputeTruthSpecial(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      uVar2 = -(uint)(iVar5 == 1) | 0xdeadcafe;
      if (iVar5 == 0) {
        uVar2 = 0;
      }
      pGVar7->Value = uVar2;
    }
    for (lVar11 = 0; uVar14 * 4 - lVar11 != 0; lVar11 = lVar11 + 4) {
      iVar1 = *(int *)((long)pUsed + lVar11);
      uVar2 = Vec_IntEntry(vLits,iVar1);
      if ((int)uVar2 < 2) {
        __assert_fail("Entry > 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                      ,0x23f,
                      "unsigned int Ga2_ObjComputeTruthSpecial(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      iVar1 = Vec_IntEntry(vLeaves,iVar1);
      pGVar7 = Gia_ManObj(p,iVar1);
      iVar1 = Abc_LitIsCompl(uVar2);
      pGVar7->Value = -iVar1 ^ *(uint *)((long)Ga2_ManComputeTruth::uTruth5 + lVar11);
      *(uint *)((long)pUsed + lVar11) = uVar2 & 0x7ffffffe;
    }
    uVar2 = Ga2_ObjComputeTruth_rec(p,pRoot,1);
    vLits->nSize = 0;
    uVar10 = 0;
    while (uVar14 != uVar10) {
      Vec_IntPush(vLits,pUsed[uVar10]);
      uVar3 = Ga2_ObjTruthDepends(uVar2,(int)uVar10);
      uVar10 = uVar10 + 1;
      if (uVar3 == 0) {
        __assert_fail("Ga2_ObjTruthDepends(Res, i)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                      ,0x24e,
                      "unsigned int Ga2_ObjComputeTruthSpecial(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
    }
    while (uVar3 = (uint)uVar14, uVar3 < 5) {
      uVar6 = Ga2_ObjTruthDepends(uVar2,uVar3);
      uVar14 = (ulong)(uVar3 + 1);
      if (uVar6 != 0) {
        __assert_fail("!Ga2_ObjTruthDepends(Res, i)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                      ,0x253,
                      "unsigned int Ga2_ObjComputeTruthSpecial(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
    }
  }
  iVar1 = 0;
  while( true ) {
    if (vLeaves->nSize <= iVar1) {
      return uVar2;
    }
    iVar5 = Vec_IntEntry(vLeaves,iVar1);
    pGVar7 = Gia_ManObj(p,iVar5);
    if (pGVar7 == (Gia_Obj_t *)0x0) break;
    pGVar7->Value = 0;
    iVar1 = iVar1 + 1;
  }
  return uVar2;
}

Assistant:

unsigned Ga2_ObjComputeTruthSpecial( Gia_Man_t * p, Gia_Obj_t * pRoot, Vec_Int_t * vLeaves, Vec_Int_t * vLits )
{
    int fVerbose = 0;
    static unsigned uTruth5[5] = { 0xAAAAAAAA, 0xCCCCCCCC, 0xF0F0F0F0, 0xFF00FF00, 0xFFFF0000 };
    unsigned Res;
    Gia_Obj_t * pObj;
    int i, Entry;
//    int Id = Gia_ObjId(p, pRoot);
    assert( Gia_ObjIsAnd(pRoot) );

    if ( fVerbose )
    printf( "Object %d.\n", Gia_ObjId(p, pRoot) );

    // assign elementary truth tables
    Gia_ManForEachObjVec( vLeaves, p, pObj, i )
    {
        Entry = Vec_IntEntry( vLits, i );
        assert( Entry >= 0 );
        if ( Entry == 0 )
            pObj->Value = 0;
        else if ( Entry == 1 )
            pObj->Value = ~0;
        else // non-trivial literal
            pObj->Value = uTruth5[i];
        if ( fVerbose )
        printf( "%d ", Entry );
    }

    if ( fVerbose )
    {
    Res = Ga2_ObjTruth( p, pRoot );
//    Kit_DsdPrintFromTruth( &Res, Vec_IntSize(vLeaves) );
    printf( "\n" );
    }

    // compute truth table
    Res = Ga2_ObjComputeTruth_rec( p, pRoot, 1 );
    if ( Res != 0 && Res != ~0 )
    {
        // find essential variables
        int nUsed = 0, pUsed[5];
        for ( i = 0; i < Vec_IntSize(vLeaves); i++ )
            if ( Ga2_ObjTruthDepends( Res, i ) )
                pUsed[nUsed++] = i;
        assert( nUsed > 0 );
        // order positions by literal value
        Vec_IntSelectSortCost( pUsed, nUsed, vLits );
        assert( Vec_IntEntry(vLits, pUsed[0]) <= Vec_IntEntry(vLits, pUsed[nUsed-1]) );
        // assign elementary truth tables to the leaves
        Gia_ManForEachObjVec( vLeaves, p, pObj, i )
        {
            Entry = Vec_IntEntry( vLits, i );
            assert( Entry >= 0 );
            if ( Entry == 0 )
                pObj->Value = 0;
            else if ( Entry == 1 )
                pObj->Value = ~0;
            else // non-trivial literal
                pObj->Value = 0xDEADCAFE; // not important
        }
        for ( i = 0; i < nUsed; i++ )
        {
            Entry = Vec_IntEntry( vLits, pUsed[i] );
            assert( Entry > 1 );
            pObj = Gia_ManObj( p, Vec_IntEntry(vLeaves, pUsed[i]) );
            pObj->Value = Abc_LitIsCompl(Entry) ? ~uTruth5[i] : uTruth5[i];
//            pObj->Value = uTruth5[i];
            // remember this literal
            pUsed[i] = Abc_LitRegular(Entry);
//            pUsed[i] = Entry;
        }
        // compute truth table
        Res = Ga2_ObjComputeTruth_rec( p, pRoot, 1 );
        // reload the literals
        Vec_IntClear( vLits );
        for ( i = 0; i < nUsed; i++ )
        {
            Vec_IntPush( vLits, pUsed[i] );
            assert( Ga2_ObjTruthDepends(Res, i) );
            if ( fVerbose )
            printf( "%d ", pUsed[i] );
        }
        for ( ; i < 5; i++ )
            assert( !Ga2_ObjTruthDepends(Res, i) );

if ( fVerbose )
{
//    Kit_DsdPrintFromTruth( &Res, nUsed );
    printf( "\n" );
}

    }
    else
    {

if ( fVerbose )
{
    Vec_IntClear( vLits );
    printf( "Const %d\n", Res > 0 );
}

    }
    Gia_ManForEachObjVec( vLeaves, p, pObj, i )
        pObj->Value = 0;
    return Res;
}